

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O3

int Abc_NodeGetLevel(Abc_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)(pObj->vFanins).nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    uVar1 = 0;
    do {
      uVar2 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]] + 0x14) >>
              0xc;
      if (uVar2 < uVar1) {
        uVar2 = uVar1;
      }
      uVar1 = uVar2;
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    return uVar1 + 1;
  }
  return 1;
}

Assistant:

int Abc_NodeGetLevel( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i, Level;
    Level = 0;
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Level = Abc_MaxInt( Level, (int)pFanin->Level );
    return Level + 1;
}